

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtextbrowser.cpp
# Opt level: O1

void QTextBrowser::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  undefined8 *puVar2;
  Data *pDVar3;
  int *piVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  QArrayDataPointer<QString> *other;
  undefined1 uVar7;
  undefined4 uVar8;
  long lVar9;
  void **ppvVar10;
  int iVar11;
  void *pvVar12;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_70;
  undefined1 local_58 [16];
  qsizetype local_48;
  QWidgetData *local_38;
  
  local_38 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    backwardAvailable((QTextBrowser *)_o,*_a[1]);
    break;
  case 1:
    forwardAvailable((QTextBrowser *)_o,*_a[1]);
    break;
  case 2:
    iVar11 = 2;
    ppvVar10 = (void **)0x0;
    goto LAB_004b000f;
  case 3:
    local_58._8_8_ = _a[1];
    ppvVar10 = (void **)local_58;
    local_58._0_8_ = (Data *)0x0;
    iVar11 = 3;
    goto LAB_004b000f;
  case 4:
    local_58._8_8_ = _a[1];
    ppvVar10 = (void **)local_58;
    local_58._0_8_ = (Data *)0x0;
    iVar11 = 4;
    goto LAB_004b000f;
  case 5:
    local_58._8_8_ = _a[1];
    ppvVar10 = (void **)local_58;
    local_58._0_8_ = (Data *)0x0;
    iVar11 = 5;
LAB_004b000f:
    QMetaObject::activate(_o,&staticMetaObject,iVar11,ppvVar10);
    break;
  case 6:
    pvVar12 = _a[1];
    uVar8 = *_a[2];
    lVar9 = *(long *)_o;
    goto LAB_004b0026;
  case 7:
    pvVar12 = _a[1];
    lVar9 = *(long *)_o;
    uVar8 = 0;
LAB_004b0026:
    (**(code **)(lVar9 + 0x210))(_o,pvVar12,uVar8);
    break;
  case 8:
    (**(code **)(*(long *)_o + 0x1f0))(_o);
    break;
  case 9:
    (**(code **)(*(long *)_o + 0x1f8))(_o);
    break;
  case 10:
    (**(code **)(*(long *)_o + 0x200))(_o);
    break;
  case 0xb:
    (**(code **)(*(long *)_o + 0x208))(_o);
  }
  if (_c != ReadProperty) {
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_004afefa_caseD_3;
      plVar1 = (long *)_a[1];
      if (((code *)*plVar1 == backwardAvailable) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_004afefa_caseD_3;
      }
      if (((code *)*plVar1 == forwardAvailable) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto switchD_004afefa_caseD_3;
      }
      if (((code *)*plVar1 == historyChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 2;
        goto switchD_004afefa_caseD_3;
      }
      if (((code *)*plVar1 == sourceChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 3;
        goto switchD_004afefa_caseD_3;
      }
      if (((code *)*plVar1 == highlighted) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 4;
        goto switchD_004afefa_caseD_3;
      }
      if (((code *)*plVar1 == anchorClicked) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 5;
        goto switchD_004afefa_caseD_3;
      }
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_004afefa_caseD_3;
        goto switchD_004afefa_caseD_1;
      }
    }
    goto switchD_004afefa_caseD_2;
  }
switchD_004afefa_caseD_1:
  if (4 < (uint)_id) goto LAB_004b026f;
  puVar2 = (undefined8 *)*_a;
  switch(_id) {
  case 0:
    source((QTextBrowser *)local_58);
    pDVar3 = (Data *)*puVar2;
    *puVar2 = local_58._0_8_;
    local_58._0_8_ = pDVar3;
    QUrl::~QUrl((QUrl *)local_58);
    break;
  case 1:
    lVar9 = *(long *)(*(long *)(_o + 8) + 0x3d8);
    if (lVar9 == 0) {
      uVar8 = 0;
    }
    else {
      uVar8 = *(undefined4 *)(*(long *)(*(long *)(_o + 8) + 0x3d0) + -8 + lVar9 * 0x38);
    }
    *(undefined4 *)puVar2 = uVar8;
    break;
  case 2:
    lVar9 = *(long *)(_o + 8);
    piVar4 = *(int **)(lVar9 + 0x408);
    uVar5 = *(undefined8 *)(lVar9 + 0x410);
    uVar6 = *(undefined8 *)(lVar9 + 0x418);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    local_70.d = (Data *)0x0;
    local_70.ptr = (QString *)0x0;
    local_70.size = 0;
    local_58._0_8_ = *puVar2;
    local_58._8_8_ = puVar2[1];
    *puVar2 = piVar4;
    puVar2[1] = uVar5;
    local_48 = puVar2[2];
    puVar2[2] = uVar6;
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_58);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
    break;
  case 3:
    uVar7 = *(undefined1 *)(*(long *)(_o + 8) + 0x422);
    goto LAB_004b0242;
  case 4:
    uVar7 = *(undefined1 *)(*(long *)(_o + 8) + 0x423);
LAB_004b0242:
    *(undefined1 *)puVar2 = uVar7;
  }
LAB_004b026f:
  if (_c == WriteProperty) {
switchD_004afefa_caseD_2:
    if ((uint)_id < 5) {
      other = (QArrayDataPointer<QString> *)*_a;
      switch(_id) {
      case 0:
        (**(code **)(*(long *)_o + 0x210))(_o,other,0);
        break;
      case 2:
        QArrayDataPointer<QString>::operator=
                  ((QArrayDataPointer<QString> *)(*(long *)(_o + 8) + 0x408),other);
        break;
      case 3:
        *(undefined1 *)(*(long *)(_o + 8) + 0x422) = *(undefined1 *)&other->d;
        break;
      case 4:
        *(undefined1 *)(*(long *)(_o + 8) + 0x423) = *(undefined1 *)&other->d;
      }
    }
  }
switchD_004afefa_caseD_3:
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowser::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTextBrowser *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->backwardAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->forwardAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->historyChanged(); break;
        case 3: _t->sourceChanged((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 4: _t->highlighted((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 5: _t->anchorClicked((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 6: _t->setSource((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QTextDocument::ResourceType>>(_a[2]))); break;
        case 7: _t->setSource((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        case 8: _t->backward(); break;
        case 9: _t->forward(); break;
        case 10: _t->home(); break;
        case 11: _t->reload(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(bool )>(_a, &QTextBrowser::backwardAvailable, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(bool )>(_a, &QTextBrowser::forwardAvailable, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)()>(_a, &QTextBrowser::historyChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(const QUrl & )>(_a, &QTextBrowser::sourceChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(const QUrl & )>(_a, &QTextBrowser::highlighted, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextBrowser::*)(const QUrl & )>(_a, &QTextBrowser::anchorClicked, 5))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QUrl*>(_v) = _t->source(); break;
        case 1: *reinterpret_cast<QTextDocument::ResourceType*>(_v) = _t->sourceType(); break;
        case 2: *reinterpret_cast<QStringList*>(_v) = _t->searchPaths(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->openExternalLinks(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->openLinks(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSource(*reinterpret_cast<QUrl*>(_v)); break;
        case 2: _t->setSearchPaths(*reinterpret_cast<QStringList*>(_v)); break;
        case 3: _t->setOpenExternalLinks(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setOpenLinks(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}